

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FeatureSetDefaults::~FeatureSetDefaults(FeatureSetDefaults *this)

{
  ~FeatureSetDefaults(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

FeatureSetDefaults::~FeatureSetDefaults() {
  // @@protoc_insertion_point(destructor:google.protobuf.FeatureSetDefaults)
  SharedDtor(*this);
}